

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapcache.cpp
# Opt level: O2

void __thiscall QPMCache::resizeKeyArray(QPMCache *this,int size)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  
  if ((size != 0) && (this->keyArraySize < size)) {
    piVar2 = (int *)realloc(this->keyArray,(long)size * 4);
    this->keyArray = piVar2;
    iVar1 = this->keyArraySize;
    for (lVar3 = 0; (long)size - (long)iVar1 != lVar3; lVar3 = lVar3 + 1) {
      piVar2[iVar1 + lVar3] = iVar1 + 1 + (int)lVar3;
    }
    this->keyArraySize = size;
  }
  return;
}

Assistant:

void QPMCache::resizeKeyArray(int size)
{
    if (size <= keyArraySize || size == 0)
        return;
    keyArray = q_check_ptr(static_cast<int *>(realloc(keyArray,
                    size * sizeof(int))));
    for (int i = keyArraySize; i != size; ++i)
        keyArray[i] = i + 1;
    keyArraySize = size;
}